

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::ExpandLinkItems
          (cmTarget *this,string *prop,string *value,string *config,cmTarget *headTarget,
          bool usage_requirements_only,vector<cmLinkItem,_std::allocator<cmLinkItem>_> *items,
          bool *hadHeadSensitiveCondition)

{
  _Alloc_hider this_00;
  char *pcVar1;
  allocator local_159;
  cmGeneratorExpression ge;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libs;
  string local_128;
  string local_108;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)0x0);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&dagChecker,&this->Name,prop,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  if (usage_requirements_only) {
    dagChecker.TransitivePropertiesOnly = true;
  }
  libs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  libs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  libs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&local_128,(string *)&ge);
  this_00._M_p = local_128._M_dataplus._M_p;
  local_128._M_dataplus._M_p = (pointer)0x0;
  cge.x_ = (cmCompiledGeneratorExpression *)this_00._M_p;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&local_128);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  pcVar1 = cmCompiledGeneratorExpression::Evaluate
                     ((cmCompiledGeneratorExpression *)this_00._M_p,this->Makefile,config,false,
                      headTarget,this,&dagChecker,&local_108);
  std::__cxx11::string::string((string *)&local_128,pcVar1,&local_159);
  cmSystemTools::ExpandListArgument(&local_128,&libs,false);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  LookupLinkItems(this,&libs,items);
  *hadHeadSensitiveCondition = (cge.x_)->HadHeadSensitiveCondition;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&libs);
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return;
}

Assistant:

void cmTarget::ExpandLinkItems(std::string const& prop,
                               std::string const& value,
                               std::string const& config,
                               cmTarget const* headTarget,
                               bool usage_requirements_only,
                               std::vector<cmLinkItem>& items,
                               bool& hadHeadSensitiveCondition) const
{
  cmGeneratorExpression ge;
  cmGeneratorExpressionDAGChecker dagChecker(this->GetName(), prop, 0, 0);
  // The $<LINK_ONLY> expression may be in a link interface to specify private
  // link dependencies that are otherwise excluded from usage requirements.
  if(usage_requirements_only)
    {
    dagChecker.SetTransitivePropertiesOnly();
    }
  std::vector<std::string> libs;
  cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(value);
  cmSystemTools::ExpandListArgument(cge->Evaluate(
                                      this->Makefile,
                                      config,
                                      false,
                                      headTarget,
                                      this, &dagChecker), libs);
  this->LookupLinkItems(libs, items);
  hadHeadSensitiveCondition = cge->GetHadHeadSensitiveCondition();
}